

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Pop
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it)

{
  pointer *ppuVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pcVar4;
  iterator iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  PositionType PVar7;
  PositionType PVar8;
  iterator local_28;
  
  PVar7 = it.Position;
  local_28.Tree = it.Tree;
  pSVar2 = (this->Data).
           super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->Data).
           super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.Position = PVar7;
  if (pSVar2 == pSVar3) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0xa2,
                  "iterator cmLinkedTree<cmState::SnapshotDataType>::Pop(iterator) [T = cmState::SnapshotDataType]"
                 );
  }
  PVar8 = (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (PVar8 == ((long)pSVar3 - (long)pSVar2 >> 3) * 0x34f72c234f72c235) {
    iterator::operator++(&local_28);
    if (PVar8 == PVar7) {
      pSVar2 = (this->Data).
               super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->Data).
      super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar2 + -1;
      pcVar4 = pSVar2[-1].EntryPointCommand._M_dataplus._M_p;
      paVar6 = &pSVar2[-1].EntryPointCommand.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar6) {
        operator_delete(pcVar4,paVar6->_M_allocated_capacity + 1);
      }
      ppuVar1 = &(this->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
    }
    iVar5.Position = local_28.Position;
    iVar5.Tree = local_28.Tree;
    return iVar5;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0xa3,
                "iterator cmLinkedTree<cmState::SnapshotDataType>::Pop(iterator) [T = cmState::SnapshotDataType]"
               );
}

Assistant:

iterator Pop(iterator it)
    {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast)
      {
      this->Data.pop_back();
      this->UpPositions.pop_back();
      }
    return it;
    }